

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O3

void __thiscall Minisat::Solver::setDecisionVar(Solver *this,Var v,bool b)

{
  int iVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  long lVar3;
  
  iVar1 = (this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz;
  if ((int)CONCAT71(in_register_00000011,b) == 0) {
    if (iVar1 <= v) goto LAB_0010de41;
    pcVar2 = (this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
    lVar3 = -1;
    if (pcVar2[v] != '\0') goto LAB_0010ddf9;
  }
  else {
    if (iVar1 <= v) goto LAB_0010de41;
    pcVar2 = (this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data;
    if (pcVar2[v] == '\0') {
      lVar3 = 1;
LAB_0010ddf9:
      this->dec_vars = this->dec_vars + lVar3;
    }
  }
  if (v < iVar1) {
    pcVar2[v] = b;
    if (((this->order_heap).indices.map.sz <= v) || ((this->order_heap).indices.map.data[v] < 0)) {
      if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= v)
      goto LAB_0010de41;
      if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[v] !=
          '\0') {
        Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::insert
                  (&this->order_heap,v);
        return;
      }
    }
    return;
  }
LAB_0010de41:
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                ,0x28,
                "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
               );
}

Assistant:

inline void     Solver::setDecisionVar(Var v, bool b) 
{ 
    if      ( b && !decision[v]) dec_vars++;
    else if (!b &&  decision[v]) dec_vars--;

    decision[v] = b;
    insertVarOrder(v);
}